

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  ImGuiContext *pIVar8;
  ImVec4 *pIVar9;
  ImDrawCmd *__dest;
  long lVar10;
  void *pvVar11;
  int iVar12;
  ImDrawCmd *pIVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  pIVar8 = GImGui;
  lVar10 = (long)(this->_TextureIdStack).Size;
  if (lVar10 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar10 + -1];
  }
  uVar7 = (this->CmdBuffer).Size;
  if ((ulong)uVar7 == 0) {
    pIVar13 = (ImDrawCmd *)0x0;
  }
  else {
    if ((int)uVar7 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x35d,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar13 = (this->CmdBuffer).Data + ((ulong)uVar7 - 1);
  }
  if ((pIVar13 != (ImDrawCmd *)0x0) &&
     (((pIVar13->ElemCount == 0 || (pIVar13->TextureId == pvVar11)) &&
      (pIVar13->UserCallback == (ImDrawCallback)0x0)))) {
    if ((1 < (int)uVar7) && (pIVar13[-1].TextureId == pvVar11)) {
      lVar10 = (long)(this->_ClipRectStack).Size;
      pIVar9 = &GNullClipRect;
      if (lVar10 != 0) {
        pIVar9 = (this->_ClipRectStack).Data + lVar10 + -1;
      }
      auVar15[0] = -(*(char *)&pIVar9->x == *(char *)&pIVar13[-1].ClipRect.x);
      auVar15[1] = -(*(char *)((long)&pIVar9->x + 1) == *(char *)((long)&pIVar13[-1].ClipRect.x + 1)
                    );
      auVar15[2] = -(*(char *)((long)&pIVar9->x + 2) == *(char *)((long)&pIVar13[-1].ClipRect.x + 2)
                    );
      auVar15[3] = -(*(char *)((long)&pIVar9->x + 3) == *(char *)((long)&pIVar13[-1].ClipRect.x + 3)
                    );
      auVar15[4] = -(*(char *)&pIVar9->y == *(char *)&pIVar13[-1].ClipRect.y);
      auVar15[5] = -(*(char *)((long)&pIVar9->y + 1) == *(char *)((long)&pIVar13[-1].ClipRect.y + 1)
                    );
      auVar15[6] = -(*(char *)((long)&pIVar9->y + 2) == *(char *)((long)&pIVar13[-1].ClipRect.y + 2)
                    );
      auVar15[7] = -(*(char *)((long)&pIVar9->y + 3) == *(char *)((long)&pIVar13[-1].ClipRect.y + 3)
                    );
      auVar15[8] = -(*(char *)&pIVar9->z == *(char *)&pIVar13[-1].ClipRect.z);
      auVar15[9] = -(*(char *)((long)&pIVar9->z + 1) == *(char *)((long)&pIVar13[-1].ClipRect.z + 1)
                    );
      auVar15[10] = -(*(char *)((long)&pIVar9->z + 2) ==
                     *(char *)((long)&pIVar13[-1].ClipRect.z + 2));
      auVar15[0xb] = -(*(char *)((long)&pIVar9->z + 3) ==
                      *(char *)((long)&pIVar13[-1].ClipRect.z + 3));
      auVar15[0xc] = -(*(char *)&pIVar9->w == *(char *)&pIVar13[-1].ClipRect.w);
      auVar15[0xd] = -(*(char *)((long)&pIVar9->w + 1) ==
                      *(char *)((long)&pIVar13[-1].ClipRect.w + 1));
      auVar15[0xe] = -(*(char *)((long)&pIVar9->w + 2) ==
                      *(char *)((long)&pIVar13[-1].ClipRect.w + 2));
      auVar15[0xf] = -(*(char *)((long)&pIVar9->w + 3) ==
                      *(char *)((long)&pIVar13[-1].ClipRect.w + 3));
      if (((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar15[0xf] >> 7) << 0xf) == 0xffff) &&
         (pIVar13[-1].UserCallback == (ImDrawCallback)0x0)) {
        (this->CmdBuffer).Size = uVar7 - 1;
        return;
      }
    }
    pIVar13->TextureId = pvVar11;
    return;
  }
  lVar10 = (long)(this->_ClipRectStack).Size;
  pIVar9 = &GNullClipRect;
  if (lVar10 != 0) {
    pIVar9 = (this->_ClipRectStack).Data + lVar10 + -1;
  }
  fVar2 = pIVar9->x;
  fVar3 = pIVar9->z;
  lVar10 = (long)(this->_TextureIdStack).Size;
  if (lVar10 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar10 + -1];
  }
  if (fVar2 <= fVar3) {
    fVar4 = pIVar9->y;
    fVar5 = pIVar9->w;
    if (fVar4 <= fVar5) {
      iVar14 = (this->CmdBuffer).Size;
      iVar6 = (this->CmdBuffer).Capacity;
      if (iVar14 == iVar6) {
        iVar14 = iVar14 + 1;
        if (iVar6 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar6 / 2 + iVar6;
        }
        if (iVar14 < iVar12) {
          iVar14 = iVar12;
        }
        if (iVar6 < iVar14) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (ImDrawCmd *)(*(pIVar8->IO).MemAllocFn)((long)iVar14 * 0x30);
          pIVar13 = (this->CmdBuffer).Data;
          if (pIVar13 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar13,(long)(this->CmdBuffer).Size * 0x30);
          }
          pIVar13 = (this->CmdBuffer).Data;
          if (pIVar13 != (ImDrawCmd *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar13);
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar14;
        }
      }
      pIVar13 = (this->CmdBuffer).Data;
      iVar14 = (this->CmdBuffer).Size;
      (this->CmdBuffer).Size = iVar14 + 1;
      pIVar13[iVar14].ElemCount = 0;
      pIVar13[iVar14].ClipRect.x = fVar2;
      pIVar13[iVar14].ClipRect.y = fVar4;
      pIVar13[iVar14].ClipRect.z = fVar3;
      pIVar13[iVar14].ClipRect.w = fVar5;
      pIVar13[iVar14].TextureId = pvVar11;
      pIVar13[iVar14].UserCallback = (ImDrawCallback)0x0;
      (&pIVar13[iVar14].UserCallback)[1] = (ImDrawCallback)0x0;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                ,0xa8,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}